

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O2

void mbedtls_x509_crl_free(mbedtls_x509_crl *crl)

{
  mbedtls_x509_crl **ppmVar1;
  mbedtls_asn1_named_data *pmVar2;
  mbedtls_x509_crl_entry *pmVar3;
  uchar *v;
  mbedtls_x509_crl *crl_cur;
  mbedtls_asn1_named_data *v_00;
  mbedtls_x509_crl_entry *v_01;
  mbedtls_x509_crl *pmVar4;
  mbedtls_x509_crl *v_02;
  
  pmVar4 = crl;
  if (crl != (mbedtls_x509_crl *)0x0) {
    do {
      free(pmVar4->sig_opts);
      v_00 = (pmVar4->issuer).next;
      while (v_00 != (mbedtls_asn1_named_data *)0x0) {
        pmVar2 = v_00->next;
        mbedtls_zeroize(v_00,0x40);
        free(v_00);
        v_00 = pmVar2;
      }
      v_01 = (pmVar4->entry).next;
      while (v_01 != (mbedtls_x509_crl_entry *)0x0) {
        pmVar3 = v_01->next;
        mbedtls_zeroize(v_01,0x68);
        free(v_01);
        v_01 = pmVar3;
      }
      v = (pmVar4->raw).p;
      if (v != (uchar *)0x0) {
        mbedtls_zeroize(v,(pmVar4->raw).len);
        free((pmVar4->raw).p);
      }
      ppmVar1 = &pmVar4->next;
      pmVar4 = *ppmVar1;
      v_02 = crl;
    } while (*ppmVar1 != (mbedtls_x509_crl *)0x0);
    do {
      pmVar4 = v_02->next;
      mbedtls_zeroize(v_02,0x1a0);
      if (v_02 != crl) {
        free(v_02);
      }
      v_02 = pmVar4;
    } while (pmVar4 != (mbedtls_x509_crl *)0x0);
  }
  return;
}

Assistant:

void mbedtls_x509_crl_free( mbedtls_x509_crl *crl )
{
    mbedtls_x509_crl *crl_cur = crl;
    mbedtls_x509_crl *crl_prv;
    mbedtls_x509_name *name_cur;
    mbedtls_x509_name *name_prv;
    mbedtls_x509_crl_entry *entry_cur;
    mbedtls_x509_crl_entry *entry_prv;

    if( crl == NULL )
        return;

    do
    {
#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
        mbedtls_free( crl_cur->sig_opts );
#endif

        name_cur = crl_cur->issuer.next;
        while( name_cur != NULL )
        {
            name_prv = name_cur;
            name_cur = name_cur->next;
            mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
            mbedtls_free( name_prv );
        }

        entry_cur = crl_cur->entry.next;
        while( entry_cur != NULL )
        {
            entry_prv = entry_cur;
            entry_cur = entry_cur->next;
            mbedtls_zeroize( entry_prv, sizeof( mbedtls_x509_crl_entry ) );
            mbedtls_free( entry_prv );
        }

        if( crl_cur->raw.p != NULL )
        {
            mbedtls_zeroize( crl_cur->raw.p, crl_cur->raw.len );
            mbedtls_free( crl_cur->raw.p );
        }

        crl_cur = crl_cur->next;
    }
    while( crl_cur != NULL );

    crl_cur = crl;
    do
    {
        crl_prv = crl_cur;
        crl_cur = crl_cur->next;

        mbedtls_zeroize( crl_prv, sizeof( mbedtls_x509_crl ) );
        if( crl_prv != crl )
            mbedtls_free( crl_prv );
    }
    while( crl_cur != NULL );
}